

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O0

void * __thiscall QGles2CommandBuffer::retainData(QGles2CommandBuffer *this,QByteArray *data)

{
  char *pcVar1;
  QByteArray *in_RDI;
  QVarLengthArray<QByteArray,_4LL> *unaff_retaddr;
  
  QVarLengthArray<QByteArray,_4LL>::append(unaff_retaddr,in_RDI);
  QVarLengthArray<QByteArray,_4LL>::last((QVarLengthArray<QByteArray,_4LL> *)0x93619c);
  pcVar1 = QByteArray::constData((QByteArray *)0x9361a4);
  return pcVar1;
}

Assistant:

const void *retainData(const QByteArray &data) {
        dataRetainPool.append(data);
        return dataRetainPool.last().constData();
    }